

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

uint ON_Locale::EnforcePeriodAsCRuntimeDecimalPoint(void)

{
  bool bVar1;
  undefined4 local_c;
  
  bVar1 = PeriodIsCRuntimeDecimalPoint();
  if (bVar1) {
    local_c = 1;
  }
  else {
    bVar1 = SetPeriodAsCRuntimeDecimalPoint();
    if (bVar1) {
      bVar1 = PeriodIsCRuntimeDecimalPoint();
      if (bVar1) {
        local_c = 2;
      }
      else {
        local_c = 0;
      }
    }
    else {
      local_c = 0;
    }
  }
  return local_c;
}

Assistant:

unsigned int ON_Locale::EnforcePeriodAsCRuntimeDecimalPoint()
{
  if (true == ON_Locale::PeriodIsCRuntimeDecimalPoint())
    return 1; // decimal point = period;

  if (false == ON_Locale::SetPeriodAsCRuntimeDecimalPoint())
    return 0; // attempt to set decimal point = period failed
  
  if (false == ON_Locale::PeriodIsCRuntimeDecimalPoint())
    return  0; // decimal point != period

  return 2; // decimal point = period
}